

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

Own<capnp::PipelineHook,_std::nullptr_t> capnp::getDisabledPipeline(void)

{
  PipelineHook *in_RDX;
  Disposer *in_RDI;
  Own<capnp::PipelineHook,_std::nullptr_t> OVar1;
  
  in_RDI->_vptr_Disposer = (_func_int **)&kj::NullDisposer::instance;
  in_RDI[1]._vptr_Disposer = (_func_int **)&getDisabledPipeline::instance;
  OVar1.ptr = in_RDX;
  OVar1.disposer = in_RDI;
  return OVar1;
}

Assistant:

kj::Own<PipelineHook> getDisabledPipeline() {
  class DisabledPipelineHook final: public PipelineHook {
  public:
    kj::Own<PipelineHook> addRef() override {
      return kj::Own<PipelineHook>(this, kj::NullDisposer::instance);
    }

    kj::Own<ClientHook> getPipelinedCap(kj::ArrayPtr<const PipelineOp> ops) override {
      return newBrokenCap(KJ_EXCEPTION(FAILED,
          "caller specified noPromisePipelining hint, but then tried to pipeline"));
    }

    kj::Own<ClientHook> getPipelinedCap(kj::Array<PipelineOp>&& ops) override {
      return newBrokenCap(KJ_EXCEPTION(FAILED,
          "caller specified noPromisePipelining hint, but then tried to pipeline"));
    }
  };
  static DisabledPipelineHook instance;
  return instance.addRef();
}